

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_temp_ext_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float fVar1;
  float fVar2;
  float __x;
  double dVar3;
  llama_token_data *plVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  
  pfVar5 = (float *)smpl->ctx;
  fVar1 = *pfVar5;
  fVar2 = pfVar5[1];
  if (0.0 < fVar2) {
    if (1 < cur_p->size) {
      fVar14 = fVar1 - fVar2;
      if (fVar14 <= 0.0) {
        fVar14 = 0.0;
      }
      fVar12 = pfVar5[2];
      fVar9 = logf(1.0 / (float)cur_p->size);
      llama_sampler_softmax_impl(cur_p);
      uVar8 = cur_p->size;
      if (uVar8 == 0) {
        fVar10 = 0.0;
      }
      else {
        lVar6 = 8;
        uVar7 = 0;
        fVar10 = 0.0;
        do {
          __x = *(float *)((long)&cur_p->data->id + lVar6);
          if (0.0 < __x) {
            fVar11 = logf(__x);
            fVar10 = fVar10 - fVar11 * __x;
            uVar8 = cur_p->size;
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0xc;
        } while (uVar7 < uVar8);
      }
      fVar12 = powf(fVar10 / -fVar9,fVar12);
      llama_sampler_temp_impl(cur_p,fVar12 * ((fVar2 + fVar1) - fVar14) + fVar14);
      if (cur_p->size != 0) {
        plVar4 = cur_p->data;
        fVar1 = plVar4->logit;
        dVar13 = 0.0;
        lVar6 = 0;
        uVar8 = 0;
        do {
          dVar3 = exp((double)*(float *)((long)&plVar4->logit + lVar6) - (double)fVar1);
          plVar4 = cur_p->data;
          *(float *)((long)&plVar4->p + lVar6) = (float)dVar3;
          dVar13 = dVar13 + dVar3;
          uVar8 = uVar8 + 1;
          uVar7 = cur_p->size;
          lVar6 = lVar6 + 0xc;
        } while (uVar8 < uVar7);
        if (uVar7 != 0) {
          pfVar5 = &plVar4->p;
          do {
            *pfVar5 = (float)((double)*pfVar5 / dVar13);
            pfVar5 = pfVar5 + 3;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
      }
    }
    return;
  }
  llama_sampler_temp_impl(cur_p,fVar1);
  return;
}

Assistant:

static void llama_sampler_temp_ext_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_temp_ext *) smpl->ctx;
    if (ctx->delta > 0) {
        const float min_temp = std::max(0.0f, ctx->temp - ctx->delta);
        const float max_temp = ctx->temp + ctx->delta;

        float exponent_val = ctx->exponent;

        // no need to do anything if there is only one (or zero) candidates
        if (cur_p->size <= 1) {
            return;
        }

        // Calculate maximum possible entropy
        float max_entropy = -logf(1.0f / cur_p->size);

        llama_sampler_softmax_impl(cur_p);

        // Calculate entropy of the softmax probabilities
        float entropy = 0.0f;
        for (size_t i = 0; i < cur_p->size; ++i) {
            float prob = cur_p->data[i].p;
            if (prob > 0.0f) { // Ensure no log(0)
                entropy -= prob * logf(prob);
            }
        }

        // Normalize the entropy (max_entropy cannot be 0 here because we checked cur_p->size != 1 above)
        float normalized_entropy = entropy / max_entropy;

        // Map the normalized entropy to the desired temperature range using the power function
        float dyn_temp = min_temp + (max_temp - min_temp) * powf(normalized_entropy, exponent_val);

    #ifdef DEBUG
        LLAMA_LOG_INFO("Your text maxtemp value is: %f\n", max_temp);
        LLAMA_LOG_INFO("Entropy: %f\n", entropy);
        LLAMA_LOG_INFO("Max Possible Entropy: %f\n", max_entropy);
        LLAMA_LOG_INFO("Normalized Entropy: %f\n", normalized_entropy);
        LLAMA_LOG_INFO("Exponent: %f\n", exponent_val);
        LLAMA_LOG_INFO("Dynamic Temperature (dyn_temp): %f\n", dyn_temp);
    #endif

        // Apply the dynamically calculated temperature scaling
        llama_sampler_temp_impl(cur_p, dyn_temp);

        // Re-compute softmax probabilities after scaling logits with dynamic temperature
        const double max_l_double = cur_p->data[0].logit;

        double cum_sum_double = 0.0;
        for (size_t i = 0; i < cur_p->size; ++i) {
            double p = exp(cur_p->data[i].logit - max_l_double);
            cur_p->data[i].p = p; // Store the scaled probability
            cum_sum_double += p;
        }

        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= cum_sum_double; // Re-normalize the probabilities
        }

    #ifdef DEBUG
        // Print the updated top 25 probabilities after temperature scaling
        LLAMA_LOG_INFO("\nUpdated Top 25 Probabilities After Dynamic Temperature Scaling (in percentages):\n");
        for (size_t i = 0; i < 25 && i < cur_p->size; ++i) {
            LLAMA_LOG_INFO("Token %zu: %f%%\n", i + 1, cur_p->data[i].p * 100.0f);
        }
    #endif
    } else {
        llama_sampler_temp_impl(cur_p, ctx->temp);
    }
}